

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Field> *
wasm::WATParser::storagetype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  bool bVar1;
  string_view expected;
  string_view expected_00;
  undefined1 local_98 [8];
  Result<wasm::Type> type;
  undefined1 local_50 [8];
  Result<wasm::Type> _val;
  
  expected._M_str = "i8";
  expected._M_len = 2;
  bVar1 = Lexer::takeKeyword(&ctx->in,expected);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::Err> = 2;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 1;
  }
  else {
    expected_00._M_str = "i16";
    expected_00._M_len = 3;
    bVar1 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar1) {
      valtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Type> *)local_98,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_50,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_98);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(string *)local_50)
        ;
        std::__detail::__variant::_Variant_storage<false,wasm::Field,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Field,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_50);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_50);
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err> = local_98;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_98);
      return __return_storage_ptr__;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::Err> = 2;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 2;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
           super__Move_assign_alias<wasm::Field,_wasm::Err>.
           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
           super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> storagetype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i8"sv)) {
    return ctx.makeI8();
  }
  if (ctx.in.takeKeyword("i16"sv)) {
    return ctx.makeI16();
  }
  auto type = valtype(ctx);
  CHECK_ERR(type);
  return ctx.makeStorageType(*type);
}